

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O3

int __thiscall Imf_2_5::Zip::compress(Zip *this,char *raw,int rawSize,char *compressed)

{
  char cVar1;
  int iVar2;
  BaseExc *this_00;
  char cVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  double dVar7;
  uLongf outSize;
  long local_20;
  
  pcVar5 = this->_tmpBuffer;
  lVar4 = (long)rawSize;
  if (0 < rawSize) {
    pcVar6 = raw + lVar4;
    do {
      *pcVar5 = *raw;
      if (pcVar6 <= raw + 1) break;
      pcVar5[rawSize + 1U >> 1] = raw[1];
      pcVar5 = pcVar5 + 1;
      raw = raw + 2;
    } while (raw < pcVar6);
    pcVar5 = this->_tmpBuffer;
    if (rawSize != 1) {
      pcVar6 = pcVar5 + 1;
      cVar3 = *pcVar5;
      do {
        cVar1 = *pcVar6;
        *pcVar6 = (cVar1 - cVar3) + -0x80;
        pcVar6 = pcVar6 + 1;
        cVar3 = cVar1;
      } while (pcVar6 < pcVar5 + lVar4);
      pcVar5 = this->_tmpBuffer;
    }
  }
  dVar7 = ceil((double)rawSize * 1.01);
  local_20 = (long)((int)dVar7 + 100);
  iVar2 = ::compress(compressed,&local_20,pcVar5,lVar4);
  if (iVar2 == 0) {
    return (int)local_20;
  }
  this_00 = (BaseExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::BaseExc::BaseExc(this_00,"Data compression (zlib) failed.");
  __cxa_throw(this_00,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

int
Zip::compress(const char *raw, int rawSize, char *compressed)
{
    //
    // Reorder the pixel data.
    //

    {
        char *t1 = _tmpBuffer;
        char *t2 = _tmpBuffer + (rawSize + 1) / 2;
        const char *stop = raw + rawSize;

        while (true)
        {
            if (raw < stop)
            *(t1++) = *(raw++);
            else
            break;

            if (raw < stop)
            *(t2++) = *(raw++);
            else
            break;
        }
    }

    //
    // Predictor.
    //

    {
        unsigned char *t    = (unsigned char *) _tmpBuffer + 1;
        unsigned char *stop = (unsigned char *) _tmpBuffer + rawSize;
        int p = t[-1];

        while (t < stop)
        {
            int d = int (t[0]) - p + (128 + 256);
            p = t[0];
            t[0] = d;
            ++t;
        }
    }

    //
    // Compress the data using zlib
    //

    uLongf outSize = int(ceil(rawSize * 1.01)) + 100;

    if (Z_OK != ::compress ((Bytef *)compressed, &outSize,
                (const Bytef *) _tmpBuffer, rawSize))
    {
        throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
    }

    return outSize;
}